

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.c
# Opt level: O3

int katherine_get_readout_temperature(katherine_device_t *device,float *temperature)

{
  int iVar1;
  char crd [8];
  float local_20 [2];
  undefined8 local_18;
  
  local_18 = 0x15000000000000;
  iVar1 = katherine_udp_send_exact(&device->control_socket,&local_18,8);
  if (iVar1 == 0) {
    iVar1 = katherine_udp_recv_exact(&device->control_socket,local_20,8);
    if (iVar1 == 0) {
      *temperature = local_20[0];
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
katherine_get_readout_temperature(katherine_device_t *device, float *temperature)
{
    int res;

    res = katherine_cmd_get_readout_temperature(&device->control_socket);
    if (res) goto err;

    char crd[8];
    res = katherine_cmd_wait_ack_crd(&device->control_socket, crd);
    if (res) goto err;

    *temperature = *(float*) crd;
    return 0;

err:
    return res;
}